

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionLexer.cxx
# Opt level: O2

void InsertText(char *upto,char *c,
               vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
               *result)

{
  cmGeneratorExpressionToken local_18;
  
  if (upto != c) {
    local_18.TokenType = 0;
    local_18.Length = (long)c - (long)upto;
    local_18.Content = upto;
    std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::
    emplace_back<cmGeneratorExpressionToken>(result,&local_18);
  }
  return;
}

Assistant:

static void InsertText(const char* upto, const char* c,
                       std::vector<cmGeneratorExpressionToken>& result)
{
  if (upto != c) {
    result.push_back(cmGeneratorExpressionToken(
      cmGeneratorExpressionToken::Text, upto, c - upto));
  }
}